

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions.hpp
# Opt level: O1

void __thiscall
chaiscript::dispatch::
Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
::Proxy_Function_Callable_Impl
          (Proxy_Function_Callable_Impl<const_chaiscript::File_Position_&(const_chaiscript::AST_Node_&),_chaiscript::dispatch::detail::Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node>_>
           *this,Const_Caller<const_chaiscript::File_Position_&,_chaiscript::AST_Node> f)

{
  undefined8 in_RDX;
  offset_in_AST_Node_to_subr in_RSI;
  initializer_list<chaiscript::Type_Info> __l;
  allocator_type local_69;
  vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_> local_68;
  Type_Info local_50;
  pointer_____offset_0x10___ *local_38;
  pointer_____offset_0x10___ *local_30;
  undefined4 local_28;
  
  local_50.m_type_info = (type_info *)&File_Position::typeinfo;
  local_50.m_bare_type_info = (type_info *)&File_Position::typeinfo;
  local_50.m_flags = 3;
  local_38 = &AST_Node::typeinfo;
  local_30 = &AST_Node::typeinfo;
  local_28 = 3;
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::vector<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>::vector
            (&local_68,__l,&local_69);
  Proxy_Function_Impl_Base::Proxy_Function_Impl_Base
            (&this->super_Proxy_Function_Impl_Base,&local_68);
  if (local_68.super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<chaiscript::Type_Info,_std::allocator<chaiscript::Type_Info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  (this->super_Proxy_Function_Impl_Base).super_Proxy_Function_Base._vptr_Proxy_Function_Base =
       (_func_int **)&PTR__Proxy_Function_Base_0031d5b0;
  (this->m_f).m_func = in_RSI;
  *(undefined8 *)&(this->m_f).field_0x8 = in_RDX;
  return;
}

Assistant:

Proxy_Function_Callable_Impl(Callable f)
          : Proxy_Function_Impl_Base(detail::build_param_type_list(static_cast<Func *>(nullptr))),
            m_f(std::move(f))
        {
        }